

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcFragDepthTests.cpp
# Opt level: O0

void __thiscall deqp::FragDepthCompareCase::~FragDepthCompareCase(FragDepthCompareCase *this)

{
  FragDepthCompareCase *this_local;
  
  ~FragDepthCompareCase(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

FragDepthCompareCase::~FragDepthCompareCase(void)
{
}